

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwshandshake.hpp
# Opt level: O0

void WebSocketHandshakeKeyGen::base64(uchar *src,char *dst)

{
  char *pcVar1;
  int local_24;
  int i;
  char *b64;
  char *dst_local;
  uchar *src_local;
  
  b64 = dst;
  for (local_24 = 0; local_24 < 0x12; local_24 = local_24 + 3) {
    *b64 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)(uint)src[local_24] >> 2];
    b64[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(int)((src[local_24] & 3) << 4 | (int)(src[local_24 + 1] & 0xf0) >> 4)];
    pcVar1 = b64 + 3;
    b64[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
             [(int)((src[local_24 + 1] & 0xf) << 2 | (int)(src[local_24 + 2] & 0xc0) >> 6)];
    b64 = b64 + 4;
    *pcVar1 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
              [(int)(src[local_24 + 2] & 0x3f)];
  }
  *b64 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
         [(int)(uint)src[0x12] >> 2];
  b64[1] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)((src[0x12] & 3) << 4 | (int)(src[0x13] & 0xf0) >> 4)];
  b64[2] = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
           [(int)((src[0x13] & 0xf) << 2)];
  b64[3] = '=';
  return;
}

Assistant:

static inline void base64(unsigned char *src, char *dst) {
        const char *b64 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
        for (int i = 0; i < 18; i += 3) {
            *dst++ = b64[(src[i] >> 2) & 63];
            *dst++ = b64[((src[i] & 3) << 4) | ((src[i + 1] & 240) >> 4)];
            *dst++ = b64[((src[i + 1] & 15) << 2) | ((src[i + 2] & 192) >> 6)];
            *dst++ = b64[src[i + 2] & 63];
        }
        *dst++ = b64[(src[18] >> 2) & 63];
        *dst++ = b64[((src[18] & 3) << 4) | ((src[19] & 240) >> 4)];
        *dst++ = b64[((src[19] & 15) << 2)];
        *dst++ = '=';
    }